

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O0

matrix3 * matrix3_scalev2(matrix3 *self,vector2 *scale)

{
  matrix3 *pmVar1;
  undefined1 local_60 [8];
  matrix3 scalingMatrix;
  vector2 *scale_local;
  matrix3 *self_local;
  
  scalingMatrix.field_0.m[8] = (double)scale;
  pmVar1 = matrix3_make_transformation_scalingv2((matrix3 *)local_60,scale);
  pmVar1 = matrix3_multiply(self,pmVar1);
  return pmVar1;
}

Assistant:

HYPAPI struct matrix3 *matrix3_scalev2(struct matrix3 *self, const struct vector2 *scale)
{
	struct matrix3 scalingMatrix;

	return matrix3_multiply(self,
		matrix3_make_transformation_scalingv2(&scalingMatrix, scale));
}